

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ColumnsFromExprList(Parse *pParse,ExprList *pEList,i16 *pnCol,Column **paCol)

{
  long lVar1;
  uint uVar2;
  void *pvVar3;
  Column *pCVar4;
  bool bVar5;
  Column *local_b0;
  int local_a4;
  int iCol;
  Table *pTab;
  Expr *pColExpr;
  Hash ht;
  Column *pCStack_70;
  int nName;
  char *zName;
  Expr *p;
  Column *pCStack_58;
  int nCol;
  Column *pCol;
  Column *aCol;
  uint local_40;
  u32 cnt;
  int j;
  int i;
  sqlite3 *db;
  Column **paCol_local;
  i16 *pnCol_local;
  ExprList *pEList_local;
  Parse *pParse_local;
  
  _j = pParse->db;
  db = (sqlite3 *)paCol;
  paCol_local = (Column **)pnCol;
  pnCol_local = (i16 *)pEList;
  pEList_local = (ExprList *)pParse;
  sqlite3HashInit((Hash *)&pColExpr);
  if (pnCol_local == (i16 *)0x0) {
    p._4_4_ = 0;
    pCol = (Column *)0x0;
  }
  else {
    p._4_4_ = *(int *)pnCol_local;
    pCol = (Column *)sqlite3DbMallocZero(_j,(long)p._4_4_ << 5);
  }
  *(short *)paCol_local = (short)p._4_4_;
  db->pVfs = (sqlite3_vfs *)pCol;
  cnt = 0;
  pCStack_58 = pCol;
  while( true ) {
    bVar5 = false;
    if ((int)cnt < p._4_4_) {
      bVar5 = _j->mallocFailed == '\0';
    }
    if (!bVar5) break;
    pTab = (Table *)sqlite3ExprSkipCollate
                              (*(Expr **)(*(long *)(pnCol_local + 4) + (long)(int)cnt * 0x20));
    pCStack_70 = *(Column **)(*(long *)(pnCol_local + 4) + (long)(int)cnt * 0x20 + 8);
    if (pCStack_70 == (Column *)0x0) {
      for (; *(char *)&pTab->zName == 'z'; pTab = (Table *)pTab->pSelect) {
      }
      if ((*(char *)&pTab->zName == -0x68) &&
         (lVar1._0_2_ = pTab->iPKey, lVar1._2_2_ = pTab->nCol, lVar1._4_2_ = pTab->nRowLogEst,
         lVar1._6_2_ = pTab->szTabRow, lVar1 != 0)) {
        local_a4 = (int)*(short *)&pTab->pCheck;
        if (local_a4 < 0) {
          local_a4 = (int)*(short *)(*(long *)&pTab->iPKey + 0x40);
        }
        if (local_a4 < 0) {
          local_b0 = (Column *)0x1b05d9;
        }
        else {
          local_b0 = *(Column **)(*(long *)(*(long *)&pTab->iPKey + 8) + (long)local_a4 * 0x20);
        }
        pCStack_70 = local_b0;
      }
      else if (*(char *)&pTab->zName == '7') {
        pCStack_70 = pTab->aCol;
      }
      else {
        pCStack_70 = *(Column **)(*(long *)(pnCol_local + 4) + (long)(int)cnt * 0x20 + 0x10);
      }
    }
    pCStack_70 = (Column *)sqlite3MPrintf(_j,"%s",pCStack_70);
    aCol._4_4_ = 0;
    while( true ) {
      bVar5 = false;
      if (pCStack_70 != (Column *)0x0) {
        pvVar3 = sqlite3HashFind((Hash *)&pColExpr,(char *)pCStack_70);
        bVar5 = pvVar3 != (void *)0x0;
      }
      if (!bVar5) break;
      ht.ht._4_4_ = sqlite3Strlen30((char *)pCStack_70);
      uVar2 = ht.ht._4_4_;
      if (0 < (int)ht.ht._4_4_) {
        do {
          local_40 = uVar2 - 1;
          bVar5 = false;
          if (0 < (int)local_40) {
            bVar5 = (""[*(byte *)((long)pCStack_70 + (long)(int)local_40)] & 4) != 0;
          }
          uVar2 = local_40;
        } while (bVar5);
        if (*(char *)((long)pCStack_70 + (long)(int)local_40) == ':') {
          ht.ht._4_4_ = local_40;
        }
      }
      aCol._4_4_ = aCol._4_4_ + 1;
      pCStack_70 = (Column *)sqlite3MPrintf(_j,"%.*z:%u",(ulong)ht.ht._4_4_,pCStack_70);
      if (3 < aCol._4_4_) {
        sqlite3_randomness(4,(void *)((long)&aCol + 4));
      }
    }
    pCStack_58->zName = (char *)pCStack_70;
    if ((pCStack_70 != (Column *)0x0) &&
       (pCVar4 = (Column *)sqlite3HashInsert((Hash *)&pColExpr,(char *)pCStack_70,pCStack_58),
       pCVar4 == pCStack_58)) {
      sqlite3OomFault(_j);
    }
    cnt = cnt + 1;
    pCStack_58 = pCStack_58 + 1;
  }
  sqlite3HashClear((Hash *)&pColExpr);
  if (_j->mallocFailed == '\0') {
    pParse_local._4_4_ = 0;
  }
  else {
    for (local_40 = 0; (int)local_40 < (int)cnt; local_40 = local_40 + 1) {
      sqlite3DbFree(_j,pCol[(int)local_40].zName);
    }
    sqlite3DbFree(_j,pCol);
    db->pVfs = (sqlite3_vfs *)0x0;
    *(undefined2 *)paCol_local = 0;
    pParse_local._4_4_ = 7;
  }
  return pParse_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3ColumnsFromExprList(
  Parse *pParse,          /* Parsing context */
  ExprList *pEList,       /* Expr list from which to derive column names */
  i16 *pnCol,             /* Write the number of columns here */
  Column **paCol          /* Write the new column list here */
){
  sqlite3 *db = pParse->db;   /* Database connection */
  int i, j;                   /* Loop counters */
  u32 cnt;                    /* Index added to make the name unique */
  Column *aCol, *pCol;        /* For looping over result columns */
  int nCol;                   /* Number of columns in the result set */
  Expr *p;                    /* Expression for a single result column */
  char *zName;                /* Column name */
  int nName;                  /* Size of name in zName[] */
  Hash ht;                    /* Hash table of column names */

  sqlite3HashInit(&ht);
  if( pEList ){
    nCol = pEList->nExpr;
    aCol = sqlite3DbMallocZero(db, sizeof(aCol[0])*nCol);
    testcase( aCol==0 );
  }else{
    nCol = 0;
    aCol = 0;
  }
  assert( nCol==(i16)nCol );
  *pnCol = nCol;
  *paCol = aCol;

  for(i=0, pCol=aCol; i<nCol && !db->mallocFailed; i++, pCol++){
    /* Get an appropriate name for the column
    */
    p = sqlite3ExprSkipCollate(pEList->a[i].pExpr);
    if( (zName = pEList->a[i].zName)!=0 ){
      /* If the column contains an "AS <name>" phrase, use <name> as the name */
    }else{
      Expr *pColExpr = p;  /* The expression that is the result column name */
      Table *pTab;         /* Table associated with this expression */
      while( pColExpr->op==TK_DOT ){
        pColExpr = pColExpr->pRight;
        assert( pColExpr!=0 );
      }
      if( pColExpr->op==TK_COLUMN && ALWAYS(pColExpr->pTab!=0) ){
        /* For columns use the column name name */
        int iCol = pColExpr->iColumn;
        pTab = pColExpr->pTab;
        if( iCol<0 ) iCol = pTab->iPKey;
        zName = iCol>=0 ? pTab->aCol[iCol].zName : "rowid";
      }else if( pColExpr->op==TK_ID ){
        assert( !ExprHasProperty(pColExpr, EP_IntValue) );
        zName = pColExpr->u.zToken;
      }else{
        /* Use the original text of the column expression as its name */
        zName = pEList->a[i].zSpan;
      }
    }
    zName = sqlite3MPrintf(db, "%s", zName);

    /* Make sure the column name is unique.  If the name is not unique,
    ** append an integer to the name so that it becomes unique.
    */
    cnt = 0;
    while( zName && sqlite3HashFind(&ht, zName)!=0 ){
      nName = sqlite3Strlen30(zName);
      if( nName>0 ){
        for(j=nName-1; j>0 && sqlite3Isdigit(zName[j]); j--){}
        if( zName[j]==':' ) nName = j;
      }
      zName = sqlite3MPrintf(db, "%.*z:%u", nName, zName, ++cnt);
      if( cnt>3 ) sqlite3_randomness(sizeof(cnt), &cnt);
    }
    pCol->zName = zName;
    sqlite3ColumnPropertiesFromName(0, pCol);
    if( zName && sqlite3HashInsert(&ht, zName, pCol)==pCol ){
      sqlite3OomFault(db);
    }
  }
  sqlite3HashClear(&ht);
  if( db->mallocFailed ){
    for(j=0; j<i; j++){
      sqlite3DbFree(db, aCol[j].zName);
    }
    sqlite3DbFree(db, aCol);
    *paCol = 0;
    *pnCol = 0;
    return SQLITE_NOMEM_BKPT;
  }
  return SQLITE_OK;
}